

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::_::Mapper<kj::Array<capnp::EnumSchema::Enumerant>_>::~Mapper
          (Mapper<kj::Array<capnp::EnumSchema::Enumerant>_> *this)

{
  Enumerant *pEVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  pEVar1 = (this->array).ptr;
  if (pEVar1 != (Enumerant *)0x0) {
    sVar2 = (this->array).size_;
    pAVar3 = (this->array).disposer;
    (this->array).ptr = (Enumerant *)0x0;
    (this->array).size_ = 0;
    (*(code *)**(undefined8 **)pAVar3)(pAVar3,pEVar1,0x40,sVar2,sVar2,0);
  }
  return;
}

Assistant:

Mapper(T&& array): array(kj::fwd<T>(array)) {}